

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

void __thiscall
Clique::translate(Clique *this,size_t *translation_table,size_t table_size,size_t new_capacity)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *alloc;
  size_type in_RCX;
  ulong in_RDX;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  alignment_set_t *new_alignment_set;
  size_type in_stack_ffffffffffffff88;
  pointer puVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong local_48;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_29;
  
  local_29.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._9_8_ = in_RCX;
  local_29._17_8_ = in_RDX;
  alloc = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x20);
  this_01 = &local_29;
  this_00 = alloc;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x25ea54);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (this_01,local_29.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._9_8_,(unsigned_long)this_00,
             (allocator<unsigned_long> *)alloc);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x25ea7d);
  local_29.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._1_8_ = alloc;
  for (local_48 = 0; local_48 < (ulong)local_29._17_8_; local_48 = local_48 + 1) {
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                      (in_RDI,in_stack_ffffffffffffff88);
    if (bVar1) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (this_00,(size_type)alloc,SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  puVar2 = in_RDI[1].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25eb32);
    operator_delete(puVar2);
  }
  in_RDI[1].m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_29.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._1_8_;
  return;
}

Assistant:

void Clique::translate(size_t* translation_table, size_t table_size, size_t new_capacity) {
	alignment_set_t* new_alignment_set = new alignment_set_t(new_capacity);
	for (size_t i=0; i<table_size; ++i) {
		if (alignment_set->test(translation_table[i])) {
			new_alignment_set->set(i,true);
		}
	}
	delete alignment_set;
	alignment_set = new_alignment_set;
}